

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool SignSignature(SigningProvider *provider,CTransaction *txFrom,CMutableTransaction *txTo,uint nIn
                  ,int nHashType,SignatureData *sig_data)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  pCVar1 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1) / 0x68) <= (ulong)nIn) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0x2c6,
                  "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
                 );
  }
  uVar5 = (ulong)pCVar1[nIn].prevout.n;
  pCVar2 = (txFrom->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(txFrom->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar2;
  if (uVar5 < (ulong)(lVar4 / 0x28)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      bVar3 = SignSignature(provider,&pCVar2[uVar5].scriptPubKey,txTo,nIn,&pCVar2[uVar5].nValue,
                            nHashType,sig_data);
      return bVar3;
    }
    __stack_chk_fail(provider,0x28,lVar4 % 0x28);
  }
  __assert_fail("txin.prevout.n < txFrom.vout.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                ,0x2c8,
                "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
               );
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CTransaction& txFrom, CMutableTransaction& txTo, unsigned int nIn, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());
    const CTxIn& txin = txTo.vin[nIn];
    assert(txin.prevout.n < txFrom.vout.size());
    const CTxOut& txout = txFrom.vout[txin.prevout.n];

    return SignSignature(provider, txout.scriptPubKey, txTo, nIn, txout.nValue, nHashType, sig_data);
}